

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::verifyImagesAreEqual(DeepImage *img1,DeepImage *img2,int dx,int dy)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  DeepImageLevel *pDVar5;
  DeepImageLevel *pDVar6;
  ArgExc *this;
  int x;
  int y;
  
  iVar1 = Imf_3_2::Image::levelMode();
  iVar2 = Imf_3_2::Image::levelMode();
  if (iVar1 == iVar2) {
    iVar1 = Imf_3_2::Image::levelRoundingMode();
    iVar2 = Imf_3_2::Image::levelRoundingMode();
    if (iVar1 == iVar2) {
      iVar1 = Imf_3_2::Image::numXLevels();
      iVar2 = Imf_3_2::Image::numXLevels();
      if (iVar1 == iVar2) {
        iVar1 = Imf_3_2::Image::numYLevels();
        iVar2 = Imf_3_2::Image::numYLevels();
        if (iVar1 == iVar2) {
          iVar1 = Imf_3_2::Image::levelMode();
          if (iVar1 == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"        level 0");
            std::endl<char,std::char_traits<char>>(poVar4);
            pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,0);
            pDVar6 = (DeepImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,0);
            verifyLevelsAreEqual(pDVar5,pDVar6,dx,dy);
            return;
          }
          if (iVar1 == 1) {
            iVar1 = 0;
            while( true ) {
              iVar2 = Imf_3_2::Image::numLevels();
              if (iVar2 <= iVar1) break;
              poVar4 = std::operator<<((ostream *)&std::cout,"        level ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
              poVar4 = std::operator<<(poVar4,"");
              std::endl<char,std::char_traits<char>>(poVar4);
              pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img1 + 0x20))(img1,iVar1);
              pDVar6 = (DeepImageLevel *)(**(code **)(*(long *)img2 + 0x20))(img2,iVar1);
              verifyLevelsAreEqual(pDVar5,pDVar6,dx,dy);
              iVar1 = iVar1 + 1;
            }
          }
          else {
            if (iVar1 != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                            ,0xaf,
                            "void (anonymous namespace)::verifyImagesAreEqual(const DeepImage &, const DeepImage &, int, int)"
                           );
            }
            iVar1 = 0;
            while( true ) {
              iVar2 = Imf_3_2::Image::numYLevels();
              if (iVar2 <= iVar1) break;
              iVar2 = 0;
              while( true ) {
                iVar3 = Imf_3_2::Image::numXLevels();
                if (iVar3 <= iVar2) break;
                poVar4 = std::operator<<((ostream *)&std::cout,"        level (");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
                poVar4 = std::operator<<(poVar4,", ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
                poVar4 = std::operator<<(poVar4,")");
                std::endl<char,std::char_traits<char>>(poVar4);
                pDVar5 = (DeepImageLevel *)(**(code **)(*(long *)img1 + 0x30))(img1,iVar2,iVar1);
                pDVar6 = (DeepImageLevel *)(**(code **)(*(long *)img2 + 0x30))(img2,iVar2,iVar1);
                verifyLevelsAreEqual(pDVar5,pDVar6,dx,dy);
                iVar2 = iVar2 + 1;
              }
              iVar1 = iVar1 + 1;
            }
          }
          return;
        }
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this,"different number of levels");
    }
    else {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this,"different level rounding modes");
    }
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this,"different level modes");
  }
  __cxa_throw(this,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyImagesAreEqual (
    const DeepImage& img1, const DeepImage& img2, int dx = 0, int dy = 0)
{
    if (img1.levelMode () != img2.levelMode ())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode () != img2.levelRoundingMode ())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels () != img2.numXLevels () ||
        img1.numYLevels () != img2.numYLevels ())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode ())
    {
        case ONE_LEVEL:

            cout << "        level 0" << endl;

            verifyLevelsAreEqual (img1.level (), img2.level (), dx, dy);

            break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img1.numLevels (); ++x)
            {
                cout << "        level " << x << "" << endl;

                verifyLevelsAreEqual (img1.level (x), img2.level (x), dx, dy);
            }

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img1.numYLevels (); ++y)
            {
                for (int x = 0; x < img1.numXLevels (); ++x)
                {
                    cout << "        level (" << x << ", " << y << ")" << endl;

                    verifyLevelsAreEqual (
                        img1.level (x, y), img2.level (x, y), dx, dy);
                }
            }

            break;

        default: assert (false);
    }
}